

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O1

bool __thiscall absl::lts_20250127::Mutex::AwaitCommon(Mutex *this,Condition *cond,KernelTimeout t)

{
  bool bVar1;
  bool bVar2;
  undefined1 *puVar3;
  SynchWaitParams waitp;
  SynchWaitParams local_60;
  
  AssertReaderHeld(this);
  bVar1 = (*cond->eval_)(cond);
  bVar2 = true;
  if (!bVar1) {
    puVar3 = kExclusiveS;
    if (((this->mu_).super___atomic_base<long>._M_i & 8U) == 0) {
      puVar3 = kSharedS;
    }
    local_60.thread = &base_internal::CurrentThreadIdentityIfPresent()->per_thread_synch;
    if ((ThreadIdentity *)local_60.thread == (ThreadIdentity *)0x0) {
      local_60.thread = &synchronization_internal::CreateThreadIdentity()->per_thread_synch;
    }
    local_60.cvmu = (Mutex *)0x0;
    local_60.cv_word = (atomic<long> *)0x0;
    local_60.how = (MuHow)puVar3;
    local_60.cond = cond;
    local_60.timeout.rep_ = t.rep_;
    if (base_internal::CycleClock::cycle_clock_source_ == (code *)0x0) {
      local_60.contention_start_cycles = rdtsc();
    }
    else {
      local_60.contention_start_cycles = (*base_internal::CycleClock::cycle_clock_source_)();
    }
    local_60.contention_start_cycles = local_60.contention_start_cycles >> 2;
    local_60.should_submit_contention_data = false;
    UnlockSlow(this,&local_60);
    Block(this,local_60.thread);
    LockSlowLoop(this,&local_60,3);
    bVar2 = true;
    if (local_60.cond == (Condition *)0x0) {
      bVar2 = (*cond->eval_)(cond);
    }
    if (t.rep_ == 0xffffffffffffffff && bVar2 == false) {
      raw_log_internal::RawLog
                (kFatal,"mutex.cc",0x645,"Check %s failed: %s","res || t.has_timeout()",
                 "condition untrue on return from Await");
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/synchronization/mutex.cc"
                    ,0x645,"bool absl::Mutex::AwaitCommon(const Condition &, KernelTimeout)");
    }
  }
  return bVar2;
}

Assistant:

bool Mutex::AwaitCommon(const Condition& cond, KernelTimeout t) {
  if (kDebugMode) {
    this->AssertReaderHeld();
  }
  if (cond.Eval()) {  // condition already true; nothing to do
    return true;
  }
  MuHow how =
      (mu_.load(std::memory_order_relaxed) & kMuWriter) ? kExclusive : kShared;
  ABSL_TSAN_MUTEX_PRE_UNLOCK(this, TsanFlags(how));
  SynchWaitParams waitp(how, &cond, t, nullptr /*no cvmu*/,
                        Synch_GetPerThreadAnnotated(this),
                        nullptr /*no cv_word*/);
  this->UnlockSlow(&waitp);
  this->Block(waitp.thread);
  ABSL_TSAN_MUTEX_POST_UNLOCK(this, TsanFlags(how));
  ABSL_TSAN_MUTEX_PRE_LOCK(this, TsanFlags(how));
  this->LockSlowLoop(&waitp, kMuHasBlocked | kMuIsCond);
  bool res = waitp.cond != nullptr ||  // => cond known true from LockSlowLoop
             EvalConditionAnnotated(&cond, this, true, false, how == kShared);
  ABSL_TSAN_MUTEX_POST_LOCK(this, TsanFlags(how), 0);
  ABSL_RAW_CHECK(res || t.has_timeout(),
                 "condition untrue on return from Await");
  return res;
}